

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeNext(BtCursor *pCur,int flags)

{
  u16 uVar1;
  uint uVar2;
  MemPage *pMVar3;
  byte bVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)flags;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  if (pCur->eState == '\0') {
    uVar1 = pCur->ix;
    uVar6 = uVar1 + 1;
    pCur->ix = uVar6;
    if (pCur->pPage->nCell <= uVar6) {
      pCur->ix = uVar1;
      iVar5 = btreeNext(pCur);
      return iVar5;
    }
    if (pCur->pPage->leaf != '\0') {
      return 0;
    }
    do {
      pMVar3 = pCur->pPage;
      if (pMVar3->leaf != '\0') {
        return 0;
      }
      uVar2 = *(uint *)(pMVar3->aData +
                       (CONCAT11(pMVar3->aCellIdx[(ulong)pCur->ix * 2],
                                 pMVar3->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar3->maskPage));
      iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                               uVar2 << 0x18);
    } while (iVar5 == 0);
    return iVar5;
  }
  bVar4 = pCur->eState;
  if (bVar4 == 0) {
LAB_001558c2:
    pMVar3 = pCur->pPage;
    uVar6 = pCur->ix + 1;
    pCur->ix = uVar6;
    if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
       (iVar5 = (*sqlite3Config.xTestCallback)(0x19c), iVar5 == 0)) {
      if (pMVar3->isInit != '\0') {
        if (uVar6 < pMVar3->nCell) {
          if (pMVar3->leaf == '\0') {
LAB_00155991:
            iVar5 = moveToLeftmost(pCur);
            return iVar5;
          }
        }
        else {
          if (pMVar3->leaf == '\0') {
            uVar2 = *(uint *)(pMVar3->aData + (ulong)pMVar3->hdrOffset + 8);
            iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                     | uVar2 << 0x18);
            if (iVar5 != 0) {
              return iVar5;
            }
            goto LAB_00155991;
          }
          do {
            if (pCur->iPage == '\0') {
              pCur->eState = '\x01';
              return 0x65;
            }
            moveToParent(pCur);
          } while (pCur->pPage->nCell <= pCur->ix);
          if (pCur->pPage->intKey != '\0') {
            iVar5 = sqlite3BtreeNext(pCur,(int)uVar7);
            return iVar5;
          }
        }
        goto LAB_00155909;
      }
    }
    else {
      pMVar3->isInit = '\0';
    }
    iVar5 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12d00,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    if (2 < bVar4) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 1) {
      return 0x65;
    }
    if ((bVar4 != 2) || (pCur->eState = '\0', pCur->skipNext < 1)) goto LAB_001558c2;
LAB_00155909:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int flags){
  MemPage *pPage;
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur);
  pPage = pCur->pPage;
  if( (++pCur->ix)>=pPage->nCell ){
    pCur->ix--;
    return btreeNext(pCur);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}